

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::storeLeakInformation
          (MemoryLeakDetector *this,MemoryLeakDetectorNode *node,char *new_memory,size_t size,
          TestMemoryAllocator *allocator,char *file,size_t line)

{
  EVP_PKEY_CTX *in_RDX;
  MemoryLeakDetectorNode *in_RSI;
  MemoryLeakDetector *in_RDI;
  MemoryLeakDetectorTable *in_R9;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffac;
  
  in_RDI->allocationSequenceNumber_ = in_RDI->allocationSequenceNumber_ + 1;
  uVar1 = (uint)in_RDI->current_allocation_stage_;
  MemoryLeakDetectorNode::init(in_RSI,in_RDX);
  addMemoryCorruptionInformation(in_RDI,(char *)(*(long *)(in_RSI + 0x10) + *(long *)in_RSI));
  MemoryLeakDetectorTable::addNewNode
            (in_R9,(MemoryLeakDetectorNode *)CONCAT44(in_stack_ffffffffffffffac,uVar1));
  return;
}

Assistant:

void MemoryLeakDetector::storeLeakInformation(MemoryLeakDetectorNode * node, char *new_memory, size_t size, TestMemoryAllocator *allocator, const char *file, size_t line)
{
    node->init(new_memory, allocationSequenceNumber_++, size, allocator, current_period_, current_allocation_stage_, file, line);
    addMemoryCorruptionInformation(node->memory_ + node->size_);
    memoryTable_.addNewNode(node);
}